

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O2

uint32_t get_pure_rep_price(lzma_coder_conflict9 *coder,uint32_t rep_index,lzma_lzma_state state,
                           uint32_t pos_state)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  
  uVar2 = coder->is_rep0[state] >> 4;
  if (rep_index == 0) {
    uVar3 = (uint)lzma_rc_prices[uVar2];
    bVar1 = lzma_rc_prices[(ulong)(coder->is_rep0_long[state][pos_state] >> 4) ^ 0x7f];
  }
  else {
    uVar3 = (uint)lzma_rc_prices[(ulong)uVar2 ^ 0x7f];
    uVar2 = coder->is_rep1[state] >> 4;
    if (rep_index != 1) {
      return (uint)lzma_rc_prices[(2 - rep_index & 0x7f0 ^ (uint)coder->is_rep2[state]) >> 4] +
             lzma_rc_prices[(ulong)uVar2 ^ 0x7f] + uVar3;
    }
    bVar1 = lzma_rc_prices[uVar2];
  }
  return bVar1 + uVar3;
}

Assistant:

static inline uint32_t
get_pure_rep_price(const lzma_coder *const coder, const uint32_t rep_index,
		const lzma_lzma_state state, uint32_t pos_state)
{
	uint32_t price;

	if (rep_index == 0) {
		price = rc_bit_0_price(coder->is_rep0[state]);
		price += rc_bit_1_price(coder->is_rep0_long[state][pos_state]);
	} else {
		price = rc_bit_1_price(coder->is_rep0[state]);

		if (rep_index == 1) {
			price += rc_bit_0_price(coder->is_rep1[state]);
		} else {
			price += rc_bit_1_price(coder->is_rep1[state]);
			price += rc_bit_price(coder->is_rep2[state],
					rep_index - 2);
		}
	}

	return price;
}